

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
InternalFixupMembersImport_SectionErrors_Test::~InternalFixupMembersImport_SectionErrors_Test
          (InternalFixupMembersImport_SectionErrors_Test *this)

{
  InternalFixupMembersImport_SectionErrors_Test *this_local;
  
  ~InternalFixupMembersImport_SectionErrors_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (InternalFixupMembersImport, SectionErrors) {
    // Section key is missing.
    {
        auto const & parser1 = this->parse (R"({ "type":17, "offset":19, "addend":23 })");
        ASSERT_TRUE (parser1.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (
            parser1.last_error (),
            make_error_code (pstore::exchange::import_ns::error::ifixup_object_was_incomplete));
    }
    // Section key has an unknown value.
    {
        auto const & parser2 =
            this->parse (R"({ "section":"bad", "type":17, "offset":19, "addend":23 })");
        EXPECT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unknown_section_name));
    }
    // Section key has the wrong type.
    {
        auto const & parser3 =
            this->parse (R"({ "section":false, "type":17, "offset":19, "addend":23 })");
        EXPECT_TRUE (parser3.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser3.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}